

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_MockPlugin_installCopierRecordsTheCopierButNotInstallsItYet_Test::
TEST_MockPlugin_installCopierRecordsTheCopierButNotInstallsItYet_Test
          (TEST_MockPlugin_installCopierRecordsTheCopierButNotInstallsItYet_Test *this)

{
  TEST_MockPlugin_installCopierRecordsTheCopierButNotInstallsItYet_Test *this_local;
  
  memset(this,0,0x80);
  TEST_GROUP_CppUTestGroupMockPlugin::TEST_GROUP_CppUTestGroupMockPlugin
            (&this->super_TEST_GROUP_CppUTestGroupMockPlugin);
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).super_Utest._vptr_Utest =
       (_func_int **)
       &PTR__TEST_MockPlugin_installCopierRecordsTheCopierButNotInstallsItYet_Test_0034a970;
  return;
}

Assistant:

TEST(MockPlugin, installCopierRecordsTheCopierButNotInstallsItYet)
{
    MockFailureReporterInstaller failureReporterInstaller;

    DummyCopier copier;
    plugin.installCopier("myType", copier);
    mock().expectOneCall("foo").withOutputParameterOfTypeReturning("myType", "name", NULLPTR);
    mock().actualCall("foo").withOutputParameterOfType("myType", "name", NULLPTR);

    MockNoWayToCopyCustomTypeFailure failure(test, "myType");
    CHECK_EXPECTED_MOCK_FAILURE(failure);

    plugin.clear();
}